

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# abcResub.c
# Opt level: O2

int Abc_NtkResubstitute(Abc_Ntk_t *pNtk,int nCutMax,int nStepsMax,int nLevelsOdc,int fUpdateLevel,
                       int fVerbose,int fVeryVerbose)

{
  uint *puVar1;
  uint *puVar2;
  char cVar3;
  Abc_Ntk_t *pAVar4;
  int *piVar5;
  void **ppvVar6;
  long lVar7;
  long lVar8;
  long lVar9;
  byte bVar10;
  uint uVar11;
  int iVar12;
  abctime aVar13;
  Abc_ManCut_t *p;
  int *__ptr;
  Vec_Ptr_t *pVVar14;
  void *pvVar15;
  ulong uVar16;
  Odc_Man_t *p_00;
  Abc_Obj_t *pAVar17;
  ProgressBar *p_01;
  abctime aVar18;
  abctime aVar19;
  abctime aVar20;
  Abc_Obj_t *pAVar21;
  long *plVar22;
  Dec_Graph_t *pGraph_00;
  Abc_Obj_t *pAVar23;
  Abc_Obj_t *pAVar24;
  Abc_Obj_t *pAVar25;
  void *Entry;
  uint uVar26;
  int iVar27;
  ulong uVar28;
  Abc_Obj_t *pAVar29;
  Abc_Obj_t *pAVar30;
  uint uVar31;
  Abc_Obj_t *pAVar32;
  ulong uVar33;
  Abc_Obj_t *pAVar34;
  int iVar35;
  int i_00;
  long lVar36;
  int i;
  uint uVar37;
  Abc_Obj_t *pAVar38;
  Abc_Obj_t *pAVar39;
  uint uVar40;
  Vec_Ptr_t *pVVar41;
  char *__assertion;
  uint uVar42;
  int iVar43;
  ulong uVar44;
  int iVar45;
  int i_01;
  Dec_Graph_t *pGraph;
  void *pvVar46;
  bool bVar47;
  Abc_Obj_t *local_c8;
  
  uVar16 = (ulong)(uint)nLevelsOdc;
  aVar13 = Abc_Clock();
  if (pNtk->ntkType != ABC_NTK_STRASH) {
    __assert_fail("Abc_NtkIsStrash(pNtk)",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x96,"int Abc_NtkResubstitute(Abc_Ntk_t *, int, int, int, int, int, int)");
  }
  Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
  p = Abc_NtkManCutStart(nCutMax,100000,100000,100000);
  __ptr = (int *)calloc(1,0x128);
  *__ptr = nCutMax;
  __ptr[1] = 0x96;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 8) = pVVar14;
  bVar10 = (byte)nCutMax & 0x1f;
  uVar42 = 1 << bVar10;
  uVar44 = (ulong)(uVar42 >> 5);
  if ((int)uVar42 < 0x21) {
    uVar44 = 1;
  }
  __ptr[10] = uVar42;
  iVar35 = (int)uVar44;
  __ptr[0xb] = iVar35;
  pvVar15 = malloc((ulong)(uint)(iVar35 * 0x97) << 2);
  *(void **)(__ptr + 0xe) = pvVar15;
  uVar28 = (ulong)(uint)(iVar35 * 4);
  memset(pvVar15,0,(long)nCutMax * uVar28);
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0xc) = pVVar14;
  lVar36 = 0x96;
  pvVar46 = pvVar15;
  while( true ) {
    iVar35 = (int)uVar16;
    bVar47 = lVar36 == 0;
    lVar36 = lVar36 + -1;
    if (bVar47) break;
    Vec_PtrPush(pVVar14,pvVar46);
    pvVar46 = (void *)((long)pvVar46 + uVar28);
  }
  pvVar15 = (void *)((long)pvVar15 + (ulong)(uint)((int)uVar44 * 0x96) * 4);
  *(void **)(__ptr + 0x10) = pvVar15;
  memset(pvVar15,0xff,uVar28);
  uVar16 = 0;
  if (1 << bVar10 < 1) {
    uVar42 = 0;
  }
  uVar44 = 0;
  if (0 < nCutMax) {
    uVar44 = (ulong)(uint)nCutMax;
  }
  for (; uVar16 != uVar44; uVar16 = uVar16 + 1) {
    pvVar15 = pVVar14->pArray[uVar16];
    for (uVar26 = 0; uVar42 != uVar26; uVar26 = uVar26 + 1) {
      if ((uVar26 & 1 << ((byte)uVar16 & 0x1f)) != 0) {
        puVar1 = (uint *)((long)pvVar15 + (ulong)(uVar26 >> 5) * 4);
        *puVar1 = *puVar1 | 1 << ((byte)uVar26 & 0x1f);
      }
    }
  }
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x12) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x14) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x16) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x18) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x1a) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x1c) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x1e) = pVVar14;
  pVVar14 = Vec_PtrAlloc(0x96);
  *(Vec_Ptr_t **)(__ptr + 0x20) = pVVar14;
  if (iVar35 < 1) {
    p_00 = (Odc_Man_t *)0x0;
  }
  else {
    p_00 = Abc_NtkDontCareAlloc(nCutMax,iVar35,fVerbose,fVeryVerbose);
  }
  if (fUpdateLevel != 0) {
    Abc_NtkStartReverseLevels(pNtk,0);
  }
  if (pNtk->nObjCounts[8] != 0) {
    for (iVar35 = 0; iVar35 < pNtk->vBoxes->nSize; iVar35 = iVar35 + 1) {
      pAVar17 = Abc_NtkBox(pNtk,iVar35);
      if ((*(uint *)&pAVar17->field_0x14 & 0xf) == 8) {
        pAVar17->pNext = (Abc_Obj_t *)pAVar17->field_5;
      }
    }
  }
  __ptr[0x48] = pNtk->nObjCounts[7];
  iVar35 = pNtk->vObjs->nSize;
  p_01 = Extra_ProgressBarStart(_stdout,iVar35);
  i_00 = 0;
LAB_002b3c65:
  if (i_00 < pNtk->vObjs->nSize) {
    pAVar17 = Abc_NtkObj(pNtk,i_00);
    if ((pAVar17 == (Abc_Obj_t *)0x0) || ((*(uint *)&pAVar17->field_0x14 & 0xf) != 7))
    goto LAB_002b47df;
    if ((p_01 == (ProgressBar *)0x0) || (p_01->nItemsNext <= i_00)) {
      Extra_ProgressBarUpdate_int(p_01,i_00,(char *)0x0);
    }
    if (((ulong)pAVar17 & 1) != 0) {
      __assertion = "!Abc_ObjIsComplement(pNode)";
LAB_002b65d3:
      __assert_fail(__assertion,
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,399,"int Abc_AigNodeIsAnd(Abc_Obj_t *)");
    }
    if (pAVar17->pNtk->ntkType != ABC_NTK_STRASH) {
      __assertion = "Abc_NtkIsStrash(pNode->pNtk)";
      goto LAB_002b65d3;
    }
    if ((pAVar17->vFanins).nSize != 2) {
      __assert_fail("Abc_AigNodeIsAnd(pNode)",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                    ,0x193,"int Abc_NodeIsPersistant(Abc_Obj_t *)");
    }
    if (((pAVar17->field_0x15 & 2) != 0) || (1000 < (pAVar17->vFanouts).nSize)) goto LAB_002b47df;
    if (i_00 < iVar35) {
      aVar18 = Abc_Clock();
      pVVar14 = Abc_NodeFindCut(p,pAVar17,0);
      aVar19 = Abc_Clock();
      *(long *)(__ptr + 0x22) = *(long *)(__ptr + 0x22) + (aVar19 - aVar18);
      if (p_00 != (Odc_Man_t *)0x0) {
        aVar18 = Abc_Clock();
        Abc_NtkDontCareClear(p_00);
        Abc_NtkDontCareCompute(p_00,pAVar17,pVVar14,*(uint **)(__ptr + 0x10));
        aVar19 = Abc_Clock();
        *(long *)(__ptr + 0x24) = *(long *)(__ptr + 0x24) + (aVar19 - aVar18);
      }
      aVar18 = Abc_Clock();
      if (fUpdateLevel == 0) {
        uVar16 = 1000000000;
      }
      else {
        uVar42 = Abc_ObjRequiredLevel(pAVar17);
        uVar16 = (ulong)uVar42;
      }
      if (nStepsMax < 0) {
        __assert_fail("nSteps >= 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x753,
                      "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                     );
      }
      if (3 < (uint)nStepsMax) {
        __assert_fail("nSteps <= 3",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x754,
                      "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                     );
      }
      *(Abc_Obj_t **)(__ptr + 2) = pAVar17;
      __ptr[4] = pVVar14->nSize;
      __ptr[7] = -1;
      aVar19 = Abc_Clock();
      iVar12 = Abc_NodeMffcInside(pAVar17,pVVar14,*(Vec_Ptr_t **)(__ptr + 0x20));
      __ptr[6] = iVar12;
      aVar20 = Abc_Clock();
      *(long *)(__ptr + 0x2a) = *(long *)(__ptr + 0x2a) + (aVar20 - aVar19);
      if (__ptr[6] < 1) {
        __assert_fail("p->nMffc > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x75d,
                      "Dec_Graph_t *Abc_ManResubEval(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int, int, int)"
                     );
      }
      aVar19 = Abc_Clock();
      *(undefined4 *)(*(long *)(__ptr + 0x12) + 4) = 0;
      *(undefined4 *)(*(long *)(__ptr + 0x14) + 4) = 0;
      *(undefined4 *)(*(long *)(__ptr + 0x16) + 4) = 0;
      *(undefined4 *)(*(long *)(__ptr + 8) + 4) = 0;
      pAVar4 = pAVar17->pNtk;
      if ((pAVar4->vTravIds).pArray == (int *)0x0) {
        uVar42 = pAVar4->vObjs->nSize + 500;
        Vec_IntGrow(&pAVar4->vTravIds,uVar42);
        uVar44 = 0;
        if (0 < (int)uVar42) {
          uVar44 = (ulong)uVar42;
        }
        for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
          (pAVar4->vTravIds).pArray[uVar28] = 0;
        }
        (pAVar4->vTravIds).nSize = uVar42;
      }
      iVar12 = pAVar4->nTravIds;
      pAVar4->nTravIds = iVar12 + 1;
      if (0x3ffffffe < iVar12) {
        __assert_fail("p->nTravIds < (1<<30)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abc/abc.h"
                      ,0x198,"void Abc_NtkIncrementTravId(Abc_Ntk_t *)");
      }
      for (iVar12 = 0; iVar12 < pVVar14->nSize; iVar12 = iVar12 + 1) {
        pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar12);
        Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 8),pAVar21);
        Abc_NodeSetTravIdCurrent(pAVar21);
      }
      for (iVar12 = 0; iVar12 < (*(Vec_Ptr_t **)(__ptr + 0x20))->nSize; iVar12 = iVar12 + 1) {
        pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x20),iVar12);
        *(byte *)((long)pvVar15 + 0x14) = *(byte *)((long)pvVar15 + 0x14) | 0x10;
      }
      Abc_ManResubCollectDivs_rec(pAVar17,*(Vec_Ptr_t **)(__ptr + 8));
      iVar12 = 0;
      while( true ) {
        iVar27 = (*(Vec_Ptr_t **)(__ptr + 0x20))->nSize;
        if (iVar27 <= iVar12) break;
        pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x20),iVar12);
        *(byte *)((long)pvVar15 + 0x14) = *(byte *)((long)pvVar15 + 0x14) & 0xef;
        iVar12 = iVar12 + 1;
      }
      pVVar41 = *(Vec_Ptr_t **)(__ptr + 8);
      iVar12 = pVVar41->nSize;
      iVar27 = (iVar12 - pVVar14->nSize) + iVar27;
      if (*(int *)(*(long *)(__ptr + 0xc) + 4) - *__ptr <= iVar27) goto LAB_002b4774;
      iVar43 = 0;
      uVar44 = (ulong)(uint)(*(int *)(*(long *)(__ptr + 0xc) + 4) - (iVar27 + *__ptr));
      for (iVar27 = 0; iVar27 < iVar12; iVar27 = iVar27 + 1) {
        plVar22 = (long *)Vec_PtrEntry(pVVar41,iVar27);
        iVar12 = *(int *)((long)plVar22 + 0x2c);
        if (iVar12 < 0x65) {
          for (lVar36 = 0; lVar36 < iVar12; lVar36 = lVar36 + 1) {
            pAVar21 = *(Abc_Obj_t **)
                       (*(long *)(*(long *)(*plVar22 + 0x20) + 8) +
                       (long)*(int *)(plVar22[6] + lVar36 * 4) * 8);
            iVar12 = Abc_NodeIsTravIdCurrent(pAVar21);
            if ((((iVar12 == 0) && ((int)(*(uint *)&pAVar21->field_0x14 >> 0xc) <= (int)uVar16)) &&
                (1 < (*(uint *)&pAVar21->field_0x14 & 0xf) - 3)) &&
               ((iVar12 = Abc_NodeIsTravIdCurrent
                                    ((Abc_Obj_t *)
                                     pAVar21->pNtk->vObjs->pArray[*(pAVar21->vFanins).pArray]),
                iVar12 != 0 &&
                (iVar12 = Abc_NodeIsTravIdCurrent
                                    ((Abc_Obj_t *)
                                     pAVar21->pNtk->vObjs->pArray[(pAVar21->vFanins).pArray[1]]),
                iVar12 != 0)))) {
              piVar5 = (pAVar21->vFanins).pArray;
              ppvVar6 = pAVar21->pNtk->vObjs->pArray;
              if (((Abc_Obj_t *)ppvVar6[*piVar5] != pAVar17) &&
                 ((Abc_Obj_t *)ppvVar6[piVar5[1]] != pAVar17)) {
                Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 8),pAVar21);
                Abc_NodeSetTravIdCurrent(pAVar21);
                iVar43 = iVar43 + 1;
                if (iVar43 == (int)uVar44) {
                  iVar12 = *(int *)(*(long *)(__ptr + 8) + 4);
                  goto LAB_002b406c;
                }
              }
            }
            iVar12 = *(int *)((long)plVar22 + 0x2c);
          }
        }
        pVVar41 = *(Vec_Ptr_t **)(__ptr + 8);
        iVar12 = pVVar41->nSize;
      }
LAB_002b406c:
      __ptr[5] = iVar12;
      for (iVar12 = 0; iVar12 < (*(Vec_Ptr_t **)(__ptr + 0x20))->nSize; iVar12 = iVar12 + 1) {
        pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x20),iVar12);
        Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 8),pvVar15);
      }
      iVar12 = *(int *)(*(long *)(__ptr + 8) + 4);
      if ((long)iVar12 < 1) {
        __assert_fail("p->nSize > 0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/misc/vec/vecPtr.h"
                      ,0x1b7,"void *Vec_PtrEntryLast(Vec_Ptr_t *)");
      }
      if (*(Abc_Obj_t **)(*(long *)(*(long *)(__ptr + 8) + 8) + -8 + (long)iVar12 * 8) != pAVar17) {
        __assert_fail("pRoot == Vec_PtrEntryLast(p->vDivs)",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x1f5,
                      "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
      }
      if (*(int *)(*(long *)(__ptr + 0xc) + 4) - *__ptr < iVar12 - pVVar14->nSize) {
        __assert_fail("Vec_PtrSize(p->vDivs) - Vec_PtrSize(vLeaves) <= Vec_PtrSize(p->vSims) - p->nLeavesMax"
                      ,
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x1f7,
                      "int Abc_ManResubCollectDivs(Abc_ManRes_t *, Abc_Obj_t *, Vec_Ptr_t *, int)");
      }
      aVar20 = Abc_Clock();
      *(long *)(__ptr + 0x28) = *(long *)(__ptr + 0x28) + (aVar20 - aVar19);
      *(ulong *)(__ptr + 0x45) =
           CONCAT44((int)((ulong)*(undefined8 *)(__ptr + 0x45) >> 0x20) +
                    (int)*(undefined8 *)(__ptr + 4),
                    (int)*(undefined8 *)(__ptr + 0x45) +
                    (int)((ulong)*(undefined8 *)(__ptr + 4) >> 0x20));
      aVar19 = Abc_Clock();
      pVVar14 = *(Vec_Ptr_t **)(__ptr + 8);
      iVar12 = __ptr[4];
      pVVar41 = *(Vec_Ptr_t **)(__ptr + 0xc);
      iVar27 = pVVar14->nSize;
      if (pVVar41->nSize - *__ptr < iVar27 - iVar12) {
        __assert_fail("Vec_PtrSize(vDivs) - nLeaves <= Vec_PtrSize(vSims) - nLeavesMax",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x23d,"void Abc_ManResubSimulate(Vec_Ptr_t *, int, Vec_Ptr_t *, int, int)");
      }
      uVar33 = (ulong)(uint)(*__ptr - iVar12);
      uVar28 = 0;
      uVar44 = (ulong)(uint)__ptr[0xb];
      if (__ptr[0xb] < 1) {
        uVar44 = uVar28;
      }
      while (iVar43 = (int)uVar28, iVar43 < iVar27) {
        plVar22 = (long *)Vec_PtrEntry(pVVar14,iVar43);
        if (iVar43 < iVar12) {
          pvVar15 = Vec_PtrEntry(pVVar41,iVar43);
          plVar22[7] = (long)pvVar15;
        }
        else {
          pvVar15 = Vec_PtrEntry(pVVar41,(int)uVar33 + iVar43);
          plVar22[7] = (long)pvVar15;
          lVar36 = *(long *)(*(long *)(*plVar22 + 0x20) + 8);
          lVar7 = *(long *)(*(long *)(lVar36 + (long)*(int *)plVar22[4] * 8) + 0x38);
          lVar36 = *(long *)(*(long *)(lVar36 + (long)((int *)plVar22[4])[1] * 8) + 0x38);
          uVar42 = *(uint *)((long)plVar22 + 0x14);
          if ((uVar42 >> 10 & 1) == 0) {
            if ((uVar42 >> 0xb & 1) == 0) {
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                *(uint *)((long)pvVar15 + uVar28 * 4) =
                     *(uint *)(lVar36 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4);
              }
            }
            else {
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                *(uint *)((long)pvVar15 + uVar28 * 4) =
                     ~*(uint *)(lVar36 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4);
              }
            }
          }
          else if ((uVar42 >> 0xb & 1) == 0) {
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              *(uint *)((long)pvVar15 + uVar28 * 4) =
                   ~*(uint *)(lVar7 + uVar28 * 4) & *(uint *)(lVar36 + uVar28 * 4);
            }
          }
          else {
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              *(uint *)((long)pvVar15 + uVar28 * 4) =
                   ~(*(uint *)(lVar36 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4));
            }
          }
        }
        iVar27 = pVVar14->nSize;
        uVar28 = (ulong)(iVar43 + 1);
      }
      for (iVar12 = 0; iVar12 < iVar27; iVar12 = iVar12 + 1) {
        pvVar15 = Vec_PtrEntry(pVVar14,iVar12);
        puVar1 = *(uint **)((long)pvVar15 + 0x38);
        uVar42 = *puVar1;
        *(uint *)((long)pvVar15 + 0x14) =
             *(uint *)((long)pvVar15 + 0x14) & 0xffffff7f | (uVar42 & 1) << 7;
        if ((uVar42 & 1) != 0) {
          for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            puVar2 = puVar1 + uVar28;
            *puVar2 = ~*puVar2;
          }
        }
        iVar27 = pVVar14->nSize;
      }
      aVar20 = Abc_Clock();
      *(long *)(__ptr + 0x2c) = *(long *)(__ptr + 0x2c) + (aVar20 - aVar19);
      aVar19 = Abc_Clock();
      lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
      uVar42 = __ptr[0xb];
      uVar44 = 0;
      if (0 < (int)uVar42) {
        uVar44 = (ulong)uVar42;
      }
      for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
        if ((*(uint *)(lVar36 + uVar28 * 4) & *(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4)) != 0)
        {
          uVar44 = uVar28 & 0xffffffff;
          break;
        }
      }
      if ((uint)uVar44 != uVar42) {
        iVar12 = 0;
        do {
          if (__ptr[5] <= iVar12) goto LAB_002b4399;
          pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 8),iVar12);
          uVar42 = __ptr[0xb];
          uVar44 = 0;
          if (0 < (int)uVar42) {
            uVar44 = (ulong)uVar42;
          }
          for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                (*(uint *)(lVar36 + uVar28 * 4) ^
                *(uint *)((long)(pAVar21->field_5).pData + uVar28 * 4))) != 0) {
              uVar44 = uVar28 & 0xffffffff;
              break;
            }
          }
          iVar12 = iVar12 + 1;
        } while ((uint)uVar44 != uVar42);
        pGraph_00 = Abc_ManResubQuit0(*(Abc_Obj_t **)(__ptr + 2),pAVar21);
        if (pGraph_00 != (Dec_Graph_t *)0x0) {
          aVar20 = Abc_Clock();
          *(long *)(__ptr + 0x2e) = *(long *)(__ptr + 0x2e) + (aVar20 - aVar19);
          __ptr[0x3b] = __ptr[0x3b] + 1;
          __ptr[7] = __ptr[6];
          goto LAB_002b477c;
        }
LAB_002b4399:
        if ((nStepsMax == 0) || (__ptr[6] == 1)) {
          aVar20 = Abc_Clock();
          *(long *)(__ptr + 0x2e) = *(long *)(__ptr + 0x2e) + (aVar20 - aVar19);
          pGraph_00 = (Dec_Graph_t *)0x0;
          goto LAB_002b477c;
        }
        *(undefined4 *)(*(long *)(__ptr + 0x12) + 4) = 0;
        *(undefined4 *)(*(long *)(__ptr + 0x14) + 4) = 0;
        *(undefined4 *)(*(long *)(__ptr + 0x16) + 4) = 0;
        lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
        for (iVar12 = 0; iVar12 < __ptr[5]; iVar12 = iVar12 + 1) {
          pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 8),iVar12);
          if ((int)(*(uint *)((long)pvVar15 + 0x14) >> 0xc) < (int)uVar16) {
            lVar7 = *(long *)((long)pvVar15 + 0x38);
            uVar42 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar42) {
              uVar44 = (ulong)uVar42;
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   ~*(uint *)(lVar36 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
            }
            else {
              uVar28 = 0;
              while ((uVar33 = uVar44, uVar44 != uVar28 &&
                     (uVar33 = uVar28,
                     (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                     ~(*(uint *)(lVar36 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4))) == 0))) {
                uVar28 = uVar28 + 1;
              }
              if ((uint)uVar33 == uVar42) {
                pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
LAB_002b447f:
                pvVar15 = (void *)((ulong)pvVar15 ^ 1);
              }
              else {
                uVar28 = 0;
                while ((uVar33 = uVar44, uVar44 != uVar28 &&
                       (uVar33 = uVar28,
                       (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                       ~*(uint *)(lVar7 + uVar28 * 4) & *(uint *)(lVar36 + uVar28 * 4)) == 0))) {
                  uVar28 = uVar28 + 1;
                }
                if ((uint)uVar33 == uVar42) {
                  pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
                }
                else {
                  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                    if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                        *(uint *)(lVar36 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) != 0) {
                      uVar44 = uVar28 & 0xffffffff;
                      break;
                    }
                  }
                  if ((uint)uVar44 == uVar42) {
                    pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
                    goto LAB_002b447f;
                  }
                  pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x16);
                }
              }
            }
            Vec_PtrPush(pVVar14,pvVar15);
          }
        }
        pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
        lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
        iVar12 = pVVar14->nSize;
        iVar27 = 0;
LAB_002b4502:
        if (iVar27 < iVar12) {
          pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar27);
          lVar7 = *(long *)(((ulong)pAVar21 & 0xfffffffffffffffe) + 0x38);
          iVar27 = iVar27 + 1;
          iVar43 = iVar27;
LAB_002b4526:
          pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
          iVar12 = pVVar14->nSize;
          if (iVar43 < iVar12) {
            pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar43);
            uVar42 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar42) {
              uVar44 = (ulong)uVar42;
            }
            lVar8 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
            uVar28 = 0;
            if (((ulong)pAVar21 & 1) == 0) {
              if (((ulong)pAVar23 & 1) == 0) {
                for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      ((*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) ^
                      *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b4607;
                }
              }
              else {
                for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      ((~*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) ^
                      *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b4607;
                }
              }
            }
            else if (((ulong)pAVar23 & 1) == 0) {
              for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    ((~*(uint *)(lVar7 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) ^
                    *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b4607;
              }
            }
            else {
              for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    ~(*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) ^
                     *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b4607;
              }
            }
            goto LAB_002b4609;
          }
          goto LAB_002b4502;
        }
        pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
        iVar12 = pVVar14->nSize;
        iVar27 = 0;
LAB_002b4682:
        if (iVar27 < iVar12) {
          pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar27);
          lVar7 = *(long *)(((ulong)pAVar21 & 0xfffffffffffffffe) + 0x38);
          iVar27 = iVar27 + 1;
          iVar43 = iVar27;
LAB_002b46ac:
          pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
          iVar12 = pVVar14->nSize;
          if (iVar43 < iVar12) {
            pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar43);
            lVar8 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
            uVar42 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar42) {
              uVar44 = (ulong)uVar42;
            }
            uVar28 = 0;
            if (((ulong)pAVar23 & 1) == 0) {
              for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    (*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) ^
                    *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b472e;
              }
            }
            else {
              for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    (~*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) ^
                    *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b472e;
              }
            }
            goto LAB_002b4730;
          }
          goto LAB_002b4682;
        }
        goto LAB_002b4758;
      }
      cVar3 = *(char *)(*(long *)(__ptr + 2) + 0x14);
      pGraph_00 = (Dec_Graph_t *)calloc(1,0x20);
      pGraph_00->fConst = 1;
      if (-1 < cVar3) {
        pGraph_00->eRoot = (Dec_Edge_t)0x1;
      }
      __ptr[0x3a] = __ptr[0x3a] + 1;
      __ptr[7] = __ptr[6];
      goto LAB_002b477c;
    }
  }
  Extra_ProgressBarStop(p_01);
  aVar18 = Abc_Clock();
  *(abctime *)(__ptr + 0x38) = aVar18 - aVar13;
  __ptr[0x49] = pNtk->nObjCounts[7];
  if (fVerbose != 0) {
    iVar35 = 0x7ab4b2;
    printf("Used constants    = %6d.             ",(ulong)(uint)__ptr[0x3a]);
    Abc_Print(iVar35,"%s =","Cuts  ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x22) / 1000000.0);
    iVar35 = 0x7ab4df;
    printf("Used replacements = %6d.             ",(ulong)(uint)__ptr[0x3b]);
    Abc_Print(iVar35,"%s =","Resub ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x26) / 1000000.0);
    iVar35 = 0x7ab50c;
    printf("Used single ORs   = %6d.             ",(ulong)(uint)__ptr[0x3c]);
    Abc_Print(iVar35,"%s ="," Div  ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x28) / 1000000.0);
    iVar35 = 0x7ab539;
    printf("Used single ANDs  = %6d.             ",(ulong)(uint)__ptr[0x3d]);
    Abc_Print(iVar35,"%s ="," Mffc ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x2a) / 1000000.0);
    iVar35 = 0x7ab566;
    printf("Used double ORs   = %6d.             ",(ulong)(uint)__ptr[0x3e]);
    Abc_Print(iVar35,"%s ="," Sim  ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x2c) / 1000000.0);
    iVar35 = 0x7ab593;
    printf("Used double ANDs  = %6d.             ",(ulong)(uint)__ptr[0x3f]);
    Abc_Print(iVar35,"%s ="," 1    ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x2e) / 1000000.0);
    iVar35 = 0x7ab5c0;
    printf("Used OR-AND       = %6d.             ",(ulong)(uint)__ptr[0x40]);
    Abc_Print(iVar35,"%s ="," D    ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x30) / 1000000.0);
    iVar35 = 0x7ab5ed;
    printf("Used AND-OR       = %6d.             ",(ulong)(uint)__ptr[0x41]);
    Abc_Print(iVar35,"%s ="," 2    ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x32) / 1000000.0);
    iVar35 = 0x7ab61a;
    printf("Used OR-2ANDs     = %6d.             ",(ulong)(uint)__ptr[0x42]);
    Abc_Print(iVar35,"%s =","Truth ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x24) / 1000000.0);
    iVar35 = 0x7ab640;
    printf("Used AND-2ORs     = %6d.             ",(ulong)(uint)__ptr[0x43]);
    Abc_Print(iVar35,"%s =","AIG   ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x36) / 1000000.0);
    iVar35 = 0x7ab66d;
    printf("TOTAL             = %6d.             ",
           (ulong)(uint)(__ptr[0x41] + __ptr[0x3d] + __ptr[0x3f] + __ptr[0x3b] +
                         __ptr[0x40] + __ptr[0x3c] + __ptr[0x3e] + __ptr[0x3a] + __ptr[0x42] +
                        __ptr[0x43]));
    Abc_Print(iVar35,"%s =","TOTAL ");
    Abc_Print(iVar35,"%9.2f sec\n",(double)*(long *)(__ptr + 0x38) / 1000000.0);
    printf("Total leaves   = %8d.\n",(ulong)(uint)__ptr[0x46]);
    printf("Total divisors = %8d.\n",(ulong)(uint)__ptr[0x45]);
    printf("Gain           = %8d. (%6.2f %%).\n",
           ((double)(__ptr[0x48] - __ptr[0x49]) * 100.0) / (double)__ptr[0x48]);
  }
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 8));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0xc));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x12));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x14));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x16));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x18));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x1a));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x1c));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x1e));
  Vec_PtrFree(*(Vec_Ptr_t **)(__ptr + 0x20));
  free(*(void **)(__ptr + 0xe));
  free(__ptr);
  Abc_NtkManCutStop(p);
  if (p_00 != (Odc_Man_t *)0x0) {
    Abc_NtkDontCareFree(p_00);
  }
  for (iVar35 = 0; iVar35 < pNtk->vObjs->nSize; iVar35 = iVar35 + 1) {
    pAVar17 = Abc_NtkObj(pNtk,iVar35);
    if (pAVar17 != (Abc_Obj_t *)0x0) {
      (pAVar17->field_5).pData = (void *)0x0;
    }
  }
  if (pNtk->nObjCounts[8] != 0) {
    for (iVar35 = 0; iVar35 < pNtk->vBoxes->nSize; iVar35 = iVar35 + 1) {
      pAVar17 = Abc_NtkBox(pNtk,iVar35);
      if ((*(uint *)&pAVar17->field_0x14 & 0xf) == 8) {
        pAVar17->field_5 = (anon_union_8_2_00a17ec8_for_Abc_Obj_t__15)pAVar17->pNext;
        pAVar17->pNext = (Abc_Obj_t *)0x0;
      }
    }
  }
  Abc_NtkReassignIds(pNtk);
  if (fUpdateLevel == 0) {
    Abc_NtkLevel(pNtk);
  }
  else {
    Abc_NtkStopReverseLevels(pNtk);
  }
  iVar35 = Abc_NtkCheck(pNtk);
  if (iVar35 == 0) {
    puts("Abc_NtkRefactor: The network check has failed.");
  }
  else {
    aVar18 = Abc_Clock();
    s_ResubTime = aVar18 - aVar13;
  }
  return (uint)(iVar35 != 0);
LAB_002b4607:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b4609:
  iVar43 = iVar43 + 1;
  if ((uint)uVar44 == uVar42) {
    __ptr[0x3c] = __ptr[0x3c] + 1;
    pAVar24 = *(Abc_Obj_t **)(__ptr + 2);
    iVar12 = 1;
    goto LAB_002b4637;
  }
  goto LAB_002b4526;
LAB_002b472e:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b4730:
  iVar43 = iVar43 + 1;
  if ((uint)uVar44 != uVar42) goto LAB_002b46ac;
  __ptr[0x3d] = __ptr[0x3d] + 1;
  pAVar24 = *(Abc_Obj_t **)(__ptr + 2);
  iVar12 = 0;
LAB_002b4637:
  pGraph_00 = Abc_ManResubQuit1(pAVar24,pAVar21,pAVar23,iVar12);
  if (pGraph_00 != (Dec_Graph_t *)0x0) {
    aVar20 = Abc_Clock();
    *(long *)(__ptr + 0x2e) = *(long *)(__ptr + 0x2e) + (aVar20 - aVar19);
    __ptr[7] = __ptr[6] + -1;
    goto LAB_002b477c;
  }
LAB_002b4758:
  aVar20 = Abc_Clock();
  *(long *)(__ptr + 0x2e) = *(long *)(__ptr + 0x2e) + (aVar20 - aVar19);
  if (nStepsMax == 1) {
LAB_002b4774:
    pGraph_00 = (Dec_Graph_t *)0x0;
    goto LAB_002b477c;
  }
  if (__ptr[6] != 2) {
    aVar19 = Abc_Clock();
    pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
    lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
    iVar12 = pVVar14->nSize;
    local_c8 = (Abc_Obj_t *)0x0;
    pAVar21 = (Abc_Obj_t *)0x0;
    iVar27 = 0;
    while (iVar27 < iVar12) {
      pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar27);
      lVar7 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
      iVar27 = iVar27 + 1;
      pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
      iVar12 = pVVar14->nSize;
      iVar43 = iVar27;
LAB_002b4862:
      if (iVar43 < iVar12) {
        pAVar24 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar43);
        lVar8 = *(long *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x38);
        iVar43 = iVar43 + 1;
        uVar42 = (uint)pAVar24;
        iVar45 = iVar43;
LAB_002b489d:
        pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x12);
        iVar12 = pVVar14->nSize;
        if (iVar45 < iVar12) {
          pAVar25 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar45);
          iVar12 = (int)uVar16;
          lVar9 = *(long *)(((ulong)pAVar25 & 0xfffffffffffffffe) + 0x38);
          uVar26 = (uint)pAVar25;
          if (((ulong)pAVar23 & 1) == 0) {
            if ((uVar42 & 1 & uVar26) == 0) {
              if ((((ulong)pAVar24 & 1) == 0) || (((ulong)pAVar25 & 1) != 0)) {
                if ((((ulong)pAVar24 & 1) == 0) && (((ulong)pAVar25 & 1) != 0)) {
                  uVar26 = __ptr[0xb];
                  uVar44 = 0;
                  if (0 < (int)uVar26) {
                    uVar44 = (ulong)uVar26;
                  }
                  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                    if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                        ((~*(uint *)(lVar9 + uVar28 * 4) |
                         *(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) ^
                        *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b4b91;
                  }
                }
                else {
                  if (((uVar26 | uVar42) & 1) != 0) {
LAB_002b6721:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                                  ,0x4f8,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
                  }
                  uVar26 = __ptr[0xb];
                  uVar44 = 0;
                  if (0 < (int)uVar26) {
                    uVar44 = (ulong)uVar26;
                  }
                  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                    if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                        ((*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4) |
                         *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                    goto LAB_002b4b91;
                  }
                }
              }
              else {
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      ((~*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4) |
                       *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b4b91;
                }
              }
            }
            else {
              uVar26 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar26) {
                uVar44 = (ulong)uVar26;
              }
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    ((~(*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4)) |
                     *(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                goto LAB_002b4b91;
              }
            }
          }
          else if ((uVar42 & 1 & uVar26) == 0) {
            if ((((ulong)pAVar24 & 1) == 0) || (((ulong)pAVar25 & 1) != 0)) {
              if ((((ulong)pAVar24 & 1) == 0) && (((ulong)pAVar25 & 1) != 0)) {
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      ((~(*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) |
                       *(uint *)(lVar8 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b4b91;
                }
              }
              else {
                if (((uVar26 | uVar42) & 1) != 0) goto LAB_002b6721;
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      ((~*(uint *)(lVar7 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4) |
                       *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b4b91;
                }
              }
            }
            else {
              uVar26 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar26) {
                uVar44 = (ulong)uVar26;
              }
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    ((~(*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) |
                     *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                goto LAB_002b4b91;
              }
            }
          }
          else {
            uVar26 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar26) {
              uVar44 = (ulong)uVar26;
            }
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ~(*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                    *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b4b91;
            }
          }
          goto LAB_002b4b94;
        }
        goto LAB_002b4862;
      }
    }
    pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
    iVar27 = pVVar14->nSize;
    iVar43 = 0;
    while (iVar12 = (int)uVar16, iVar43 < iVar27) {
      pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar43);
      lVar7 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
      iVar43 = iVar43 + 1;
      pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
      iVar27 = pVVar14->nSize;
      iVar45 = iVar43;
LAB_002b4d06:
      if (iVar45 < iVar27) {
        pAVar24 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,iVar45);
        lVar8 = *(long *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x38);
        iVar45 = iVar45 + 1;
        uVar42 = (uint)pAVar24;
        i_01 = iVar45;
LAB_002b4d41:
        pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x14);
        iVar27 = pVVar14->nSize;
        if (i_01 < iVar27) {
          pAVar25 = (Abc_Obj_t *)Vec_PtrEntry(pVVar14,i_01);
          iVar12 = (int)uVar16;
          lVar9 = *(long *)(((ulong)pAVar25 & 0xfffffffffffffffe) + 0x38);
          uVar26 = (uint)pAVar25;
          if (((ulong)pAVar23 & 1) == 0) {
            if ((uVar42 & 1 & uVar26) == 0) {
              if ((((ulong)pAVar24 & 1) == 0) || (((ulong)pAVar25 & 1) != 0)) {
                if ((((ulong)pAVar24 & 1) == 0) && (((ulong)pAVar25 & 1) != 0)) {
                  uVar26 = __ptr[0xb];
                  uVar44 = 0;
                  if (0 < (int)uVar26) {
                    uVar44 = (ulong)uVar26;
                  }
                  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                    if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                        (~*(uint *)(lVar9 + uVar28 * 4) &
                         *(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) ^
                        *(uint *)(lVar36 + uVar28 * 4))) != 0) goto LAB_002b5035;
                  }
                }
                else {
                  if (((uVar26 | uVar42) & 1) != 0) {
LAB_002b679d:
                    __assert_fail("0",
                                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                                  ,0x556,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
                  }
                  uVar26 = __ptr[0xb];
                  uVar44 = 0;
                  if (0 < (int)uVar26) {
                    uVar44 = (ulong)uVar26;
                  }
                  for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                    if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                        (*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                         *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                    goto LAB_002b5035;
                  }
                }
              }
              else {
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      (~*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                       *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b5035;
                }
              }
            }
            else {
              uVar26 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar26) {
                uVar44 = (ulong)uVar26;
              }
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    (~(*(uint *)(lVar9 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) &
                     *(uint *)(lVar7 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                goto LAB_002b5035;
              }
            }
          }
          else if ((uVar42 & 1 & uVar26) == 0) {
            if ((((ulong)pAVar24 & 1) == 0) || (((ulong)pAVar25 & 1) != 0)) {
              if ((((ulong)pAVar24 & 1) == 0) && (((ulong)pAVar25 & 1) != 0)) {
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      (~(*(uint *)(lVar9 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                       *(uint *)(lVar8 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b5035;
                }
              }
              else {
                if (((uVar26 | uVar42) & 1) != 0) goto LAB_002b679d;
                uVar26 = __ptr[0xb];
                uVar44 = 0;
                if (0 < (int)uVar26) {
                  uVar44 = (ulong)uVar26;
                }
                for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                  if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                      (~*(uint *)(lVar7 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) &
                       *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                  goto LAB_002b5035;
                }
              }
            }
            else {
              uVar26 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar26) {
                uVar44 = (ulong)uVar26;
              }
              for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
                if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                    (~(*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                     *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
                goto LAB_002b5035;
              }
            }
          }
          else {
            uVar26 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar26) {
              uVar44 = (ulong)uVar26;
            }
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ~((*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4) |
                    *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5035;
            }
          }
          goto LAB_002b5038;
        }
        goto LAB_002b4d06;
      }
    }
    goto LAB_002b5107;
  }
  goto LAB_002b47f2;
LAB_002b4b91:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b4b94:
  if ((uint)uVar44 == uVar26) {
    uVar37 = *(uint *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x14) >> 0xc;
    uVar31 = *(uint *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x14) >> 0xc;
    uVar40 = *(uint *)(((ulong)pAVar25 & 0xfffffffffffffffe) + 0x14) >> 0xc;
    uVar26 = uVar40;
    if (uVar40 < uVar31) {
      uVar26 = uVar31;
    }
    uVar11 = uVar26;
    if (uVar26 < uVar37) {
      uVar11 = uVar37;
    }
    if (iVar12 <= (int)uVar11) {
      __assert_fail("LevelMax <= Required - 1",
                    "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                    ,0x4fc,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
    }
    pAVar39 = pAVar25;
    pAVar30 = pAVar23;
    pAVar34 = pAVar24;
    if (uVar37 < uVar26) {
      pAVar39 = pAVar21;
      pAVar30 = (Abc_Obj_t *)0x0;
      pAVar34 = local_c8;
    }
    pAVar29 = pAVar30;
    pAVar32 = pAVar39;
    pAVar38 = pAVar34;
    if (((uVar31 != uVar11) ||
        (pAVar29 = pAVar24, pAVar32 = pAVar25, pAVar38 = pAVar23, pAVar21 = pAVar39,
        local_c8 = pAVar34, pAVar30 == (Abc_Obj_t *)0x0)) &&
       ((pAVar30 = pAVar29, pAVar34 = pAVar32, pAVar39 = pAVar38, uVar40 != uVar11 ||
        (pAVar30 = pAVar25, pAVar34 = pAVar24, pAVar39 = pAVar23, pAVar21 = pAVar32,
        local_c8 = pAVar38, pAVar29 == (Abc_Obj_t *)0x0)))) {
      __ptr[0x3e] = __ptr[0x3e] + 1;
      if (pAVar39 == (Abc_Obj_t *)0x0) {
        __assert_fail("pObjMin0",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x50d,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
      }
      if (pAVar34 == (Abc_Obj_t *)0x0) {
        __assert_fail("pObjMin1",
                      "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                      ,0x50e,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
      }
      pAVar21 = *(Abc_Obj_t **)(__ptr + 2);
      iVar27 = 1;
      goto LAB_002b4c94;
    }
  }
  iVar45 = iVar45 + 1;
  goto LAB_002b489d;
LAB_002b5035:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b5038:
  if ((uint)uVar44 != uVar26) {
LAB_002b50dc:
    i_01 = i_01 + 1;
    goto LAB_002b4d41;
  }
  uVar37 = *(uint *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x14) >> 0xc;
  uVar31 = *(uint *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x14) >> 0xc;
  uVar40 = *(uint *)(((ulong)pAVar25 & 0xfffffffffffffffe) + 0x14) >> 0xc;
  uVar26 = uVar40;
  if (uVar40 < uVar31) {
    uVar26 = uVar31;
  }
  uVar11 = uVar26;
  if (uVar26 < uVar37) {
    uVar11 = uVar37;
  }
  if (iVar12 <= (int)uVar11) {
    __assert_fail("LevelMax <= Required - 1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x55a,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
  }
  pAVar39 = pAVar25;
  pAVar30 = pAVar23;
  pAVar34 = pAVar24;
  if (uVar37 < uVar26) {
    pAVar39 = pAVar21;
    pAVar30 = (Abc_Obj_t *)0x0;
    pAVar34 = local_c8;
  }
  pAVar29 = pAVar30;
  pAVar32 = pAVar39;
  pAVar38 = pAVar34;
  if (((uVar31 == uVar11) &&
      (pAVar29 = pAVar24, pAVar32 = pAVar25, pAVar38 = pAVar23, pAVar21 = pAVar39,
      local_c8 = pAVar34, pAVar30 != (Abc_Obj_t *)0x0)) ||
     ((pAVar30 = pAVar29, pAVar34 = pAVar32, pAVar39 = pAVar38, uVar40 == uVar11 &&
      (pAVar30 = pAVar25, pAVar34 = pAVar24, pAVar39 = pAVar23, pAVar21 = pAVar32,
      local_c8 = pAVar38, pAVar29 != (Abc_Obj_t *)0x0)))) goto LAB_002b50dc;
  __ptr[0x3f] = __ptr[0x3f] + 1;
  if (pAVar39 == (Abc_Obj_t *)0x0) {
    __assert_fail("pObjMin0",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x56b,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
  }
  if (pAVar34 == (Abc_Obj_t *)0x0) {
    __assert_fail("pObjMin1",
                  "/workspace/llm4binary/github/license_all_cmakelists_25/FPGeh[P]abc/src/base/abci/abcResub.c"
                  ,0x56c,"Dec_Graph_t *Abc_ManResubDivs12(Abc_ManRes_t *, int)");
  }
  pAVar21 = *(Abc_Obj_t **)(__ptr + 2);
  iVar27 = 0;
LAB_002b4c94:
  pGraph_00 = Abc_ManResubQuit21(pAVar21,pAVar39,pAVar34,pAVar30,iVar27);
  if (pGraph_00 != (Dec_Graph_t *)0x0) {
    aVar20 = Abc_Clock();
    lVar36 = aVar20 - aVar19;
    goto LAB_002b57ba;
  }
LAB_002b5107:
  aVar20 = Abc_Clock();
  *(long *)(__ptr + 0x32) = *(long *)(__ptr + 0x32) + (aVar20 - aVar19);
  aVar19 = Abc_Clock();
  *(undefined4 *)(*(long *)(__ptr + 0x18) + 4) = 0;
  *(undefined4 *)(*(long *)(__ptr + 0x1a) + 4) = 0;
  *(undefined4 *)(*(long *)(__ptr + 0x1c) + 4) = 0;
  *(undefined4 *)(*(long *)(__ptr + 0x1e) + 4) = 0;
  lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
  uVar16 = (ulong)(iVar12 - 2);
  for (iVar12 = 0; iVar12 < (*(Vec_Ptr_t **)(__ptr + 0x16))->nSize; iVar12 = iVar12 + 1) {
    pvVar15 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x16),iVar12);
    if ((int)(*(uint *)((long)pvVar15 + 0x14) >> 0xc) <= (int)uVar16) {
      lVar7 = *(long *)((long)pvVar15 + 0x38);
      pvVar46 = (void *)((ulong)pvVar15 ^ 1);
      iVar27 = iVar12;
      while( true ) {
        iVar27 = iVar27 + 1;
        if ((*(Vec_Ptr_t **)(__ptr + 0x16))->nSize <= iVar27) break;
        Entry = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x16),iVar27);
        if ((int)(*(uint *)((long)Entry + 0x14) >> 0xc) <= (int)uVar16) {
          lVar8 = *(long *)((long)Entry + 0x38);
          if ((*(Vec_Ptr_t **)(__ptr + 0x18))->nSize < 500) {
            uVar42 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar42) {
              uVar44 = (ulong)uVar42;
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   ~*(uint *)(lVar36 + uVar28 * 4) &
                   *(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x18),pvVar15);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1a),Entry);
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   ~(*(uint *)(lVar36 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                   *(uint *)(lVar8 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x18),pvVar46);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1a),Entry);
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   ~(*(uint *)(lVar36 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) &
                   *(uint *)(lVar7 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x18),pvVar15);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1a),(void *)((ulong)Entry ^ 1));
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ~*(uint *)(lVar36 + uVar28 * 4) &
                  (*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4))) != 0) {
                uVar44 = uVar28 & 0xffffffff;
                break;
              }
            }
            if ((uint)uVar44 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x18),pvVar46);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1a),(void *)((ulong)Entry ^ 1));
            }
          }
          if ((*(Vec_Ptr_t **)(__ptr + 0x1c))->nSize < 500) {
            uVar42 = __ptr[0xb];
            uVar44 = 0;
            if (0 < (int)uVar42) {
              uVar44 = (ulong)uVar42;
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   ~(*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4)) &
                   *(uint *)(lVar36 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1c),pvVar15);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1e),Entry);
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   (~*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                   *(uint *)(lVar36 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1c),pvVar46);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1e),Entry);
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            uVar28 = 0;
            while ((uVar33 = uVar44, uVar44 != uVar28 &&
                   (uVar33 = uVar28,
                   (*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                   (~*(uint *)(lVar7 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) &
                   *(uint *)(lVar36 + uVar28 * 4)) == 0))) {
              uVar28 = uVar28 + 1;
            }
            if ((uint)uVar33 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1c),pvVar15);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1e),(void *)((ulong)Entry ^ 1));
              uVar42 = __ptr[0xb];
              uVar44 = 0;
              if (0 < (int)uVar42) {
                uVar44 = (ulong)uVar42;
              }
            }
            for (uVar28 = 0; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ~(*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                  *(uint *)(lVar36 + uVar28 * 4)) != 0) {
                uVar44 = uVar28 & 0xffffffff;
                break;
              }
            }
            if ((uint)uVar44 == uVar42) {
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1c),pvVar46);
              Vec_PtrPush(*(Vec_Ptr_t **)(__ptr + 0x1e),(void *)((ulong)Entry ^ 1));
            }
          }
        }
      }
    }
  }
  aVar20 = Abc_Clock();
  *(long *)(__ptr + 0x30) = *(long *)(__ptr + 0x30) + (aVar20 - aVar19);
  aVar19 = Abc_Clock();
  lVar36 = *(long *)(*(long *)(__ptr + 2) + 0x38);
  uVar42 = 0;
  while ((int)uVar42 < (*(Vec_Ptr_t **)(__ptr + 0x12))->nSize) {
    uVar16 = (ulong)uVar42;
    pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x12),uVar42);
    lVar7 = *(long *)(((ulong)pAVar21 & 0xfffffffffffffffe) + 0x38);
    iVar12 = 0;
LAB_002b5544:
    if (iVar12 < (*(Vec_Ptr_t **)(__ptr + 0x18))->nSize) {
      pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x18),iVar12);
      pAVar24 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x1a),iVar12);
      uVar42 = __ptr[0xb];
      uVar44 = 0;
      if (0 < (int)uVar42) {
        uVar44 = (ulong)uVar42;
      }
      lVar8 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
      lVar9 = *(long *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x38);
      if (((ulong)pAVar21 & 1) == 0) {
        uVar28 = 0;
        if (((ulong)pAVar23 & 1) == 0) {
          if (((ulong)pAVar24 & 1) == 0) {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ((*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) |
                   *(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5754;
            }
          }
          else {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ((~*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) |
                   *(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5754;
            }
          }
        }
        else if (((ulong)pAVar24 & 1) == 0) {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                ((~*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar9 + uVar28 * 4) |
                 *(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5754;
          }
        }
        else {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                ((*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4) |
                 *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5754;
          }
        }
      }
      else {
        uVar28 = 0;
        if (((ulong)pAVar23 & 1) == 0) {
          if (((ulong)pAVar24 & 1) == 0) {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ((*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) |
                   ~*(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5754;
            }
          }
          else {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ((~*(uint *)(lVar9 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) |
                   ~*(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5754;
            }
          }
        }
        else if (((ulong)pAVar24 & 1) == 0) {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                ((~*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar9 + uVar28 * 4) |
                 ~*(uint *)(lVar7 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5754;
          }
        }
        else {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                ((~*(uint *)(lVar7 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4) |
                 *(uint *)(lVar9 + uVar28 * 4)) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5754;
          }
        }
      }
      goto LAB_002b5757;
    }
    uVar42 = (int)uVar16 + 1;
  }
  uVar42 = 0;
  while ((int)uVar42 < (*(Vec_Ptr_t **)(__ptr + 0x14))->nSize) {
    uVar16 = (ulong)uVar42;
    pAVar21 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x14),uVar42);
    lVar7 = *(long *)(((ulong)pAVar21 & 0xfffffffffffffffe) + 0x38);
    iVar12 = 0;
LAB_002b580a:
    if (iVar12 < (*(Vec_Ptr_t **)(__ptr + 0x1c))->nSize) {
      pAVar23 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x1c),iVar12);
      pAVar24 = (Abc_Obj_t *)Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x1e),iVar12);
      uVar42 = __ptr[0xb];
      uVar44 = 0;
      if (0 < (int)uVar42) {
        uVar44 = (ulong)uVar42;
      }
      lVar8 = *(long *)(((ulong)pAVar23 & 0xfffffffffffffffe) + 0x38);
      lVar9 = *(long *)(((ulong)pAVar24 & 0xfffffffffffffffe) + 0x38);
      if (((ulong)pAVar21 & 1) == 0) {
        if (((ulong)pAVar23 & 1) == 0) {
          uVar28 = 0;
          if (((ulong)pAVar24 & 1) == 0) {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  (*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                   *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5a21;
            }
          }
          else {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  (*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                   ~*(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5a21;
            }
          }
        }
        else {
          uVar28 = 0;
          if (((ulong)pAVar24 & 1) == 0) {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  (~*(uint *)(lVar8 + uVar28 * 4) & *(uint *)(lVar7 + uVar28 * 4) &
                   *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5a21;
            }
          }
          else {
            for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
              if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                  ((*(uint *)(lVar9 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) &
                   *(uint *)(lVar7 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
              goto LAB_002b5a21;
            }
          }
        }
      }
      else if (((ulong)pAVar23 & 1) == 0) {
        uVar28 = 0;
        if (((ulong)pAVar24 & 1) == 0) {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                (~*(uint *)(lVar7 + uVar28 * 4) & *(uint *)(lVar8 + uVar28 * 4) &
                 *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5a21;
          }
        }
        else {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                (~(*(uint *)(lVar9 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                 *(uint *)(lVar8 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5a21;
          }
        }
      }
      else {
        uVar28 = 0;
        if (((ulong)pAVar24 & 1) == 0) {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                (~(*(uint *)(lVar8 + uVar28 * 4) | *(uint *)(lVar7 + uVar28 * 4)) &
                 *(uint *)(lVar9 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5a21;
          }
        }
        else {
          for (; uVar44 != uVar28; uVar28 = uVar28 + 1) {
            if ((*(uint *)(*(long *)(__ptr + 0x10) + uVar28 * 4) &
                ((*(uint *)(lVar9 + uVar28 * 4) | *(uint *)(lVar8 + uVar28 * 4)) &
                 ~*(uint *)(lVar7 + uVar28 * 4) ^ *(uint *)(lVar36 + uVar28 * 4))) != 0)
            goto LAB_002b5a21;
          }
        }
      }
      goto LAB_002b5a24;
    }
    uVar42 = (int)uVar16 + 1;
  }
  goto LAB_002b5a44;
LAB_002b5754:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b5757:
  iVar12 = iVar12 + 1;
  if ((uint)uVar44 == uVar42) {
    __ptr[0x40] = __ptr[0x40] + 1;
    pGraph_00 = Abc_ManResubQuit2(*(Abc_Obj_t **)(__ptr + 2),pAVar21,pAVar23,pAVar24,1);
    goto LAB_002b579e;
  }
  goto LAB_002b5544;
LAB_002b5a21:
  uVar44 = uVar28 & 0xffffffff;
LAB_002b5a24:
  iVar12 = iVar12 + 1;
  if ((uint)uVar44 != uVar42) goto LAB_002b580a;
  __ptr[0x41] = __ptr[0x41] + 1;
  pGraph_00 = Abc_ManResubQuit2(*(Abc_Obj_t **)(__ptr + 2),pAVar21,pAVar23,pAVar24,0);
LAB_002b579e:
  if (pGraph_00 != (Dec_Graph_t *)0x0) {
    aVar20 = Abc_Clock();
    lVar36 = aVar20 - aVar19;
LAB_002b57ba:
    *(long *)(__ptr + 0x32) = *(long *)(__ptr + 0x32) + lVar36;
    __ptr[7] = __ptr[6] + -2;
    goto LAB_002b477c;
  }
LAB_002b5a44:
  aVar20 = Abc_Clock();
  *(long *)(__ptr + 0x32) = *(long *)(__ptr + 0x32) + (aVar20 - aVar19);
  if ((nStepsMax == 2) || (__ptr[6] == 3)) {
LAB_002b47f2:
    pGraph_00 = (Dec_Graph_t *)0x0;
  }
  else {
    aVar19 = Abc_Clock();
    pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x18);
    iVar12 = pVVar14->nSize;
    uVar42 = 0;
    while ((int)uVar42 < iVar12) {
      pvVar15 = Vec_PtrEntry(pVVar14,uVar42);
      pvVar46 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x1a),uVar42);
      uVar16 = (ulong)(((uint)pvVar15 & 1) * 8 + ((uint)pvVar46 & 1) * 4);
      uVar42 = uVar42 + 1;
      pVVar14 = *(Vec_Ptr_t **)(__ptr + 0x18);
      iVar12 = pVVar14->nSize;
      if ((int)uVar42 < iVar12) {
        pvVar15 = Vec_PtrEntry(pVVar14,uVar42);
        uVar44 = (ulong)uVar42;
        pvVar46 = Vec_PtrEntry(*(Vec_Ptr_t **)(__ptr + 0x1a),uVar42);
        iVar35 = 0;
        if (0 < __ptr[0xb]) {
          iVar35 = __ptr[0xb];
        }
        iVar35 = (*(code *)(&DAT_007ab17c +
                           *(int *)(&DAT_007ab17c +
                                   (ulong)((uint)pvVar46 & 1 | (int)uVar16 + ((uint)pvVar15 & 1) * 2
                                          ) * 4)))
                           (*(undefined8 *)(((ulong)pvVar46 & 0xfffffffffffffffe) + 0x38),
                            *(undefined8 *)(((ulong)pvVar15 & 0xfffffffffffffffe) + 0x38),iVar35,
                            pvVar15,&DAT_007ab17c +
                                    *(int *)(&DAT_007ab17c +
                                            (ulong)((uint)pvVar46 & 1 |
                                                   (int)uVar16 + ((uint)pvVar15 & 1) * 2) * 4),
                            &DAT_007ab17c,uVar16,uVar44);
        return iVar35;
      }
    }
    aVar20 = Abc_Clock();
    *(long *)(__ptr + 0x34) = *(long *)(__ptr + 0x34) + (aVar20 - aVar19);
    pGraph_00 = (Dec_Graph_t *)0x0;
  }
LAB_002b477c:
  aVar19 = Abc_Clock();
  *(long *)(__ptr + 0x26) = *(long *)(__ptr + 0x26) + (aVar19 - aVar18);
  if (pGraph_00 != (Dec_Graph_t *)0x0) {
    __ptr[0x47] = __ptr[0x47] + __ptr[7];
    aVar18 = Abc_Clock();
    Dec_GraphUpdateNetwork(pAVar17,pGraph_00,fUpdateLevel,__ptr[7]);
    aVar19 = Abc_Clock();
    *(long *)(__ptr + 0x36) = *(long *)(__ptr + 0x36) + (aVar19 - aVar18);
    free(pGraph_00->pNodes);
    free(pGraph_00);
  }
LAB_002b47df:
  i_00 = i_00 + 1;
  goto LAB_002b3c65;
}

Assistant:

int Abc_NtkResubstitute( Abc_Ntk_t * pNtk, int nCutMax, int nStepsMax, int nLevelsOdc, int fUpdateLevel, int fVerbose, int fVeryVerbose )
{
    extern void           Dec_GraphUpdateNetwork( Abc_Obj_t * pRoot, Dec_Graph_t * pGraph, int fUpdateLevel, int nGain );
    ProgressBar * pProgress;
    Abc_ManRes_t * pManRes;
    Abc_ManCut_t * pManCut;
    Odc_Man_t * pManOdc = NULL;
    Dec_Graph_t * pFForm;
    Vec_Ptr_t * vLeaves;
    Abc_Obj_t * pNode;
    abctime clk, clkStart = Abc_Clock();
    int i, nNodes;

    assert( Abc_NtkIsStrash(pNtk) );

    // cleanup the AIG
    Abc_AigCleanup((Abc_Aig_t *)pNtk->pManFunc);
    // start the managers
    pManCut = Abc_NtkManCutStart( nCutMax, 100000, 100000, 100000 );
    pManRes = Abc_ManResubStart( nCutMax, ABC_RS_DIV1_MAX );
    if ( nLevelsOdc > 0 )
    pManOdc = Abc_NtkDontCareAlloc( nCutMax, nLevelsOdc, fVerbose, fVeryVerbose );

    // compute the reverse levels if level update is requested
    if ( fUpdateLevel )
        Abc_NtkStartReverseLevels( pNtk, 0 );

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pNext = (Abc_Obj_t *)pNode->pData;
    }

    // resynthesize each node once
    pManRes->nNodesBeg = Abc_NtkNodeNum(pNtk);
    nNodes = Abc_NtkObjNumMax(pNtk);
    pProgress = Extra_ProgressBarStart( stdout, nNodes );
    Abc_NtkForEachNode( pNtk, pNode, i )
    {
        Extra_ProgressBarUpdate( pProgress, i, NULL );
        // skip the constant node
//        if ( Abc_NodeIsConst(pNode) )
//            continue;
        // skip persistant nodes
        if ( Abc_NodeIsPersistant(pNode) )
            continue;
        // skip the nodes with many fanouts
        if ( Abc_ObjFanoutNum(pNode) > 1000 )
            continue;
        // stop if all nodes have been tried once
        if ( i >= nNodes )
            break;

        // compute a reconvergence-driven cut
clk = Abc_Clock();
        vLeaves = Abc_NodeFindCut( pManCut, pNode, 0 );
//        vLeaves = Abc_CutFactorLarge( pNode, nCutMax );
pManRes->timeCut += Abc_Clock() - clk;
/*
        if ( fVerbose && vLeaves )
        printf( "Node %6d : Leaves = %3d. Volume = %3d.\n", pNode->Id, Vec_PtrSize(vLeaves), Abc_CutVolumeCheck(pNode, vLeaves) );
        if ( vLeaves == NULL )
            continue;
*/
        // get the don't-cares
        if ( pManOdc )
        {
clk = Abc_Clock();
            Abc_NtkDontCareClear( pManOdc );
            Abc_NtkDontCareCompute( pManOdc, pNode, vLeaves, pManRes->pCareSet );
pManRes->timeTruth += Abc_Clock() - clk;
        }

        // evaluate this cut
clk = Abc_Clock();
        pFForm = Abc_ManResubEval( pManRes, pNode, vLeaves, nStepsMax, fUpdateLevel, fVerbose );
//        Vec_PtrFree( vLeaves );
//        Abc_ManResubCleanup( pManRes );
pManRes->timeRes += Abc_Clock() - clk;
        if ( pFForm == NULL )
            continue;
        pManRes->nTotalGain += pManRes->nLastGain;
/*
        if ( pManRes->nLeaves == 4 && pManRes->nMffc == 2 && pManRes->nLastGain == 1 )
        {
            printf( "%6d :  L = %2d. V = %2d. Mffc = %2d. Divs = %3d.   Up = %3d. Un = %3d. B = %3d.\n", 
                   pNode->Id, pManRes->nLeaves, Abc_CutVolumeCheck(pNode, vLeaves), pManRes->nMffc, pManRes->nDivs, 
                   pManRes->vDivs1UP->nSize, pManRes->vDivs1UN->nSize, pManRes->vDivs1B->nSize );
            Abc_ManResubPrintDivs( pManRes, pNode, vLeaves );
        }
*/
        // acceptable replacement found, update the graph
clk = Abc_Clock();
        Dec_GraphUpdateNetwork( pNode, pFForm, fUpdateLevel, pManRes->nLastGain );
pManRes->timeNtk += Abc_Clock() - clk;
        Dec_GraphFree( pFForm );
    }
    Extra_ProgressBarStop( pProgress );
pManRes->timeTotal = Abc_Clock() - clkStart;
    pManRes->nNodesEnd = Abc_NtkNodeNum(pNtk);

    // print statistics
    if ( fVerbose )
    Abc_ManResubPrint( pManRes );

    // delete the managers
    Abc_ManResubStop( pManRes );
    Abc_NtkManCutStop( pManCut );
    if ( pManOdc ) Abc_NtkDontCareFree( pManOdc );

    // clean the data field
    Abc_NtkForEachObj( pNtk, pNode, i )
        pNode->pData = NULL;

    if ( Abc_NtkLatchNum(pNtk) ) {
        Abc_NtkForEachLatch(pNtk, pNode, i)
            pNode->pData = pNode->pNext, pNode->pNext = NULL;
    }

    // put the nodes into the DFS order and reassign their IDs
    Abc_NtkReassignIds( pNtk );
//    Abc_AigCheckFaninOrder( pNtk->pManFunc );
    // fix the levels
    if ( fUpdateLevel )
        Abc_NtkStopReverseLevels( pNtk );
    else
        Abc_NtkLevel( pNtk );
    // check
    if ( !Abc_NtkCheck( pNtk ) )
    {
        printf( "Abc_NtkRefactor: The network check has failed.\n" );
        return 0;
    }
s_ResubTime = Abc_Clock() - clkStart;
    return 1;
}